

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_end_transaction(Pager *pPager,int hasMaster,int bCommit)

{
  u8 uVar1;
  int iVar2;
  int local_3c;
  bool local_2d;
  int local_28;
  int bDelete;
  int rc2;
  int rc;
  int bCommit_local;
  int hasMaster_local;
  Pager *pPager_local;
  
  bDelete = 0;
  local_28 = 0;
  if ((pPager->eState < 2) && (pPager->eLock < 2)) {
    pPager_local._4_4_ = 0;
  }
  else {
    releaseAllSavepoints(pPager);
    if (pPager->jfd->pMethods != (sqlite3_io_methods *)0x0) {
      iVar2 = sqlite3JournalIsInMemory(pPager->jfd);
      if (iVar2 == 0) {
        if (pPager->journalMode == '\x03') {
          if (pPager->journalOff == 0) {
            bDelete = 0;
          }
          else {
            bDelete = sqlite3OsTruncate(pPager->jfd,0);
            if ((bDelete == 0) && (pPager->fullSync != '\0')) {
              bDelete = sqlite3OsSync(pPager->jfd,(uint)pPager->syncFlags);
            }
          }
          pPager->journalOff = 0;
        }
        else if ((pPager->journalMode == '\x01') ||
                ((pPager->exclusiveMode != '\0' && (pPager->journalMode != '\x05')))) {
          local_2d = true;
          if (hasMaster == 0) {
            local_2d = pPager->tempFile != '\0';
          }
          bDelete = zeroJournalHdr(pPager,(uint)local_2d);
          pPager->journalOff = 0;
        }
        else {
          uVar1 = pPager->tempFile;
          sqlite3OsClose(pPager->jfd);
          if (uVar1 == '\0') {
            bDelete = sqlite3OsDelete(pPager->pVfs,pPager->zJournal,(uint)pPager->extraSync);
          }
        }
      }
      else {
        sqlite3OsClose(pPager->jfd);
      }
    }
    sqlite3BitvecDestroy(pPager->pInJournal);
    pPager->pInJournal = (Bitvec *)0x0;
    pPager->nRec = 0;
    if (bDelete == 0) {
      if ((pPager->memDb == '\0') && (iVar2 = pagerFlushOnCommit(pPager,bCommit), iVar2 == 0)) {
        sqlite3PcacheClearWritable(pPager->pPCache);
      }
      else {
        sqlite3PcacheCleanAll(pPager->pPCache);
      }
      sqlite3PcacheTruncate(pPager->pPCache,pPager->dbSize);
    }
    if (pPager->pWal == (Wal *)0x0) {
      if (((bDelete == 0) && (bCommit != 0)) && (pPager->dbSize < pPager->dbFileSize)) {
        bDelete = pager_truncate(pPager,pPager->dbSize);
      }
    }
    else {
      local_28 = sqlite3WalEndWriteTransaction(pPager->pWal);
    }
    if (((bDelete == 0) && (bCommit != 0)) &&
       (bDelete = sqlite3OsFileControl(pPager->fd,0x16,(void *)0x0), bDelete == 0xc)) {
      bDelete = 0;
    }
    if ((pPager->exclusiveMode == '\0') &&
       ((pPager->pWal == (Wal *)0x0 || (iVar2 = sqlite3WalExclusiveMode(pPager->pWal,0), iVar2 != 0)
        ))) {
      local_28 = pagerUnlockDb(pPager,1);
      pPager->changeCountDone = '\0';
    }
    pPager->eState = '\x01';
    pPager->setMaster = '\0';
    if (bDelete == 0) {
      local_3c = local_28;
    }
    else {
      local_3c = bDelete;
    }
    pPager_local._4_4_ = local_3c;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_end_transaction(Pager *pPager, int hasMaster, int bCommit){
  int rc = SQLITE_OK;      /* Error code from journal finalization operation */
  int rc2 = SQLITE_OK;     /* Error code from db file unlock operation */

  /* Do nothing if the pager does not have an open write transaction
  ** or at least a RESERVED lock. This function may be called when there
  ** is no write-transaction active but a RESERVED or greater lock is
  ** held under two circumstances:
  **
  **   1. After a successful hot-journal rollback, it is called with
  **      eState==PAGER_NONE and eLock==EXCLUSIVE_LOCK.
  **
  **   2. If a connection with locking_mode=exclusive holding an EXCLUSIVE 
  **      lock switches back to locking_mode=normal and then executes a
  **      read-transaction, this function is called with eState==PAGER_READER 
  **      and eLock==EXCLUSIVE_LOCK when the read-transaction is closed.
  */
  assert( assert_pager_state(pPager) );
  assert( pPager->eState!=PAGER_ERROR );
  if( pPager->eState<PAGER_WRITER_LOCKED && pPager->eLock<RESERVED_LOCK ){
    return SQLITE_OK;
  }

  releaseAllSavepoints(pPager);
  assert( isOpen(pPager->jfd) || pPager->pInJournal==0 
      || (sqlite3OsDeviceCharacteristics(pPager->fd)&SQLITE_IOCAP_BATCH_ATOMIC)
  );
  if( isOpen(pPager->jfd) ){
    assert( !pagerUseWal(pPager) );

    /* Finalize the journal file. */
    if( sqlite3JournalIsInMemory(pPager->jfd) ){
      /* assert( pPager->journalMode==PAGER_JOURNALMODE_MEMORY ); */
      sqlite3OsClose(pPager->jfd);
    }else if( pPager->journalMode==PAGER_JOURNALMODE_TRUNCATE ){
      if( pPager->journalOff==0 ){
        rc = SQLITE_OK;
      }else{
        rc = sqlite3OsTruncate(pPager->jfd, 0);
        if( rc==SQLITE_OK && pPager->fullSync ){
          /* Make sure the new file size is written into the inode right away.
          ** Otherwise the journal might resurrect following a power loss and
          ** cause the last transaction to roll back.  See
          ** https://bugzilla.mozilla.org/show_bug.cgi?id=1072773
          */
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
        }
      }
      pPager->journalOff = 0;
    }else if( pPager->journalMode==PAGER_JOURNALMODE_PERSIST
      || (pPager->exclusiveMode && pPager->journalMode!=PAGER_JOURNALMODE_WAL)
    ){
      rc = zeroJournalHdr(pPager, hasMaster||pPager->tempFile);
      pPager->journalOff = 0;
    }else{
      /* This branch may be executed with Pager.journalMode==MEMORY if
      ** a hot-journal was just rolled back. In this case the journal
      ** file should be closed and deleted. If this connection writes to
      ** the database file, it will do so using an in-memory journal.
      */
      int bDelete = !pPager->tempFile;
      assert( sqlite3JournalIsInMemory(pPager->jfd)==0 );
      assert( pPager->journalMode==PAGER_JOURNALMODE_DELETE 
           || pPager->journalMode==PAGER_JOURNALMODE_MEMORY 
           || pPager->journalMode==PAGER_JOURNALMODE_WAL 
      );
      sqlite3OsClose(pPager->jfd);
      if( bDelete ){
        rc = sqlite3OsDelete(pPager->pVfs, pPager->zJournal, pPager->extraSync);
      }
    }
  }

#ifdef SQLITE_CHECK_PAGES
  sqlite3PcacheIterateDirty(pPager->pPCache, pager_set_pagehash);
  if( pPager->dbSize==0 && sqlite3PcacheRefCount(pPager->pPCache)>0 ){
    PgHdr *p = sqlite3PagerLookup(pPager, 1);
    if( p ){
      p->pageHash = 0;
      sqlite3PagerUnrefNotNull(p);
    }
  }
#endif

  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = 0;
  pPager->nRec = 0;
  if( rc==SQLITE_OK ){
    if( MEMDB || pagerFlushOnCommit(pPager, bCommit) ){
      sqlite3PcacheCleanAll(pPager->pPCache);
    }else{
      sqlite3PcacheClearWritable(pPager->pPCache);
    }
    sqlite3PcacheTruncate(pPager->pPCache, pPager->dbSize);
  }

  if( pagerUseWal(pPager) ){
    /* Drop the WAL write-lock, if any. Also, if the connection was in 
    ** locking_mode=exclusive mode but is no longer, drop the EXCLUSIVE 
    ** lock held on the database file.
    */
    rc2 = sqlite3WalEndWriteTransaction(pPager->pWal);
    assert( rc2==SQLITE_OK );
  }else if( rc==SQLITE_OK && bCommit && pPager->dbFileSize>pPager->dbSize ){
    /* This branch is taken when committing a transaction in rollback-journal
    ** mode if the database file on disk is larger than the database image.
    ** At this point the journal has been finalized and the transaction 
    ** successfully committed, but the EXCLUSIVE lock is still held on the
    ** file. So it is safe to truncate the database file to its minimum
    ** required size.  */
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    rc = pager_truncate(pPager, pPager->dbSize);
  }

  if( rc==SQLITE_OK && bCommit ){
    rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_COMMIT_PHASETWO, 0);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  }

  if( !pPager->exclusiveMode 
   && (!pagerUseWal(pPager) || sqlite3WalExclusiveMode(pPager->pWal, 0))
  ){
    rc2 = pagerUnlockDb(pPager, SHARED_LOCK);
    pPager->changeCountDone = 0;
  }
  pPager->eState = PAGER_READER;
  pPager->setMaster = 0;

  return (rc==SQLITE_OK?rc2:rc);
}